

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

JavascriptSymbol * __thiscall
Js::ScriptContext::GetProperty<Js::JavascriptSymbol>
          (ScriptContext *this,PropertyId propertyId,PropertyRecord *propertyRecord)

{
  JavascriptSymbol *pJVar1;
  
  pJVar1 = TryGetProperty<Js::JavascriptSymbol>(this,propertyId);
  if (pJVar1 != (JavascriptSymbol *)0x0) {
    return pJVar1;
  }
  if (propertyRecord == (PropertyRecord *)0x0) {
    propertyRecord = ThreadContext::GetPropertyName(this->threadContext,propertyId);
  }
  pJVar1 = JavascriptLibrary::CreateSymbol
                     ((this->super_ScriptContextBase).javascriptLibrary,propertyRecord);
  return pJVar1;
}

Assistant:

TProperty* ScriptContext::GetProperty(PropertyId propertyId, const PropertyRecord* propertyRecord)
    {
        TProperty *prop = TryGetProperty<TProperty>(propertyId);
        if (prop != nullptr)
        {
            return prop;
        }

        propertyRecord = propertyRecord ? propertyRecord : this->GetPropertyName(propertyId);
        return CreateAndCacheSymbolOrPropertyString<TProperty>(propertyRecord);
    }